

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

void computed_property_free(gravity_class_t *c,char *name,_Bool remove_flag)

{
  gravity_closure_t *closure_00;
  gravity_function_t *pgVar1;
  gravity_value_t key_00;
  gravity_value_t key_01;
  gravity_class_t *pgVar2;
  size_t sVar3;
  gravity_closure_t *closure_01;
  gravity_closure_t *local_a8;
  gravity_function_t *f_1;
  gravity_function_t *f;
  gravity_closure_t *setter;
  gravity_closure_t *getter;
  gravity_closure_t *closure;
  gravity_value_t key;
  gravity_string_t __temp;
  _Bool remove_flag_local;
  char *name_local;
  gravity_class_t *c_local;
  
  key.field_1.p = gravity_class_string;
  __temp._71_1_ = remove_flag;
  memset(&__temp,0,0x28);
  __temp.s._0_4_ = 0;
  __temp.gc.next = (gravity_object_t *)name;
  sVar3 = strlen(name);
  __temp.s._4_4_ = (uint32_t)sVar3;
  __temp.hash = 0;
  __temp.s._0_4_ = gravity_hash_compute_buffer((char *)__temp.gc.next,__temp.s._4_4_);
  pgVar2 = gravity_class_string;
  key.isa = (gravity_class_t *)&key.field_1;
  key_00.field_1.p = key.isa;
  key_00.isa = gravity_class_string;
  closure_01 = gravity_class_lookup_closure(c,key_00);
  if (closure_01 != (gravity_closure_t *)0x0) {
    closure_00 = (gravity_closure_t *)(closure_01->f->field_9).field_2.special[0];
    if ((gravity_value_t *)(closure_01->f->field_9).field_0.cpool.m ==
        (closure_01->f->field_9).field_0.cpool.p) {
      local_a8 = (gravity_closure_t *)0x0;
    }
    else {
      local_a8 = (gravity_closure_t *)(closure_01->f->field_9).field_2.special[1];
    }
    if (closure_00 != (gravity_closure_t *)0x0) {
      pgVar1 = closure_00->f;
      gravity_closure_free((gravity_vm *)0x0,closure_00);
      gravity_function_free((gravity_vm *)0x0,pgVar1);
    }
    if (local_a8 != (gravity_closure_t *)0x0) {
      pgVar1 = local_a8->f;
      gravity_closure_free((gravity_vm *)0x0,local_a8);
      gravity_function_free((gravity_vm *)0x0,pgVar1);
    }
    if (closure_01->f != (gravity_function_t *)0x0) {
      gravity_function_free((gravity_vm *)0x0,closure_01->f);
    }
    gravity_closure_free((gravity_vm *)0x0,closure_01);
    if ((__temp._71_1_ & 1) != 0) {
      key_01.field_1.p = key.isa;
      key_01.isa = pgVar2;
      gravity_hash_remove(c->htable,key_01);
    }
    return;
  }
  __assert_fail("closure",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/runtime/gravity_core.c"
                ,0xc90,"void computed_property_free(gravity_class_t *, const char *, _Bool)");
}

Assistant:

void computed_property_free (gravity_class_t *c, const char *name, bool remove_flag) {
    STATICVALUE_FROM_STRING(key, name, strlen(name));
    gravity_closure_t *closure = gravity_class_lookup_closure(c, key);
    assert(closure);

    gravity_closure_t *getter = (gravity_closure_t *)closure->f->special[0];
    gravity_closure_t *setter = (closure->f->special[0] != closure->f->special[1]) ? (gravity_closure_t *)closure->f->special[1] : NULL;
    if (getter) {
        gravity_function_t *f = getter->f;
        gravity_closure_free(NULL, getter);
        gravity_function_free(NULL, f);
    }
    if (setter) {
        gravity_function_t *f = setter->f;
        gravity_closure_free(NULL, setter);
        gravity_function_free(NULL, f);
    }

    if (closure->f) gravity_function_free(NULL, closure->f);
    gravity_closure_free(NULL, closure);

    if (remove_flag) gravity_hash_remove(c->htable, key);
}